

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCompAdditiveExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  byte *pbVar1;
  ulong uVar2;
  
  xmlXPathCompMultiplicativeExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar1 = ctxt->cur;
    while ((uVar2 = (ulong)*pbVar1, uVar2 < 0x21 && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0))) {
      pbVar1 = pbVar1 + 1;
      ctxt->cur = pbVar1;
    }
    while (((char)uVar2 == '-' || ((int)uVar2 == 0x2b))) {
      ch1 = ctxt->comp->last;
      do {
        pbVar1 = pbVar1 + 1;
        ctxt->cur = pbVar1;
        if (0x20 < (ulong)*pbVar1) break;
      } while ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0);
      xmlXPathCompMultiplicativeExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_PLUS,(uint)((char)uVar2 == '+'),0,0,
                          (void *)0x0,(void *)0x0);
      pbVar1 = ctxt->cur;
      while ((uVar2 = (ulong)*pbVar1, uVar2 < 0x21 && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0)))
      {
        pbVar1 = pbVar1 + 1;
        ctxt->cur = pbVar1;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompAdditiveExpr(xmlXPathParserContextPtr ctxt) {

    xmlXPathCompMultiplicativeExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '+') || (CUR == '-')) {
	int plus;
	int op1 = ctxt->comp->last;

        if (CUR == '+') plus = 1;
	else plus = 0;
	NEXT;
	SKIP_BLANKS;
        xmlXPathCompMultiplicativeExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_PLUS, op1, ctxt->comp->last, plus, 0);
	SKIP_BLANKS;
    }
}